

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdEmuD3D56TlvColor::~MthdEmuD3D56TlvColor(MthdEmuD3D56TlvColor *this)

{
  pgraph::SingleMthdTest::~SingleMthdTest(&this->super_SingleMthdTest);
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.nsource, 1, 1)) {
			exp.celsius_pipe_vtx[4] = pgraph_idx_ubyte_to_float(extr(val, 16, 8));
			exp.celsius_pipe_vtx[5] = pgraph_idx_ubyte_to_float(extr(val, 8, 8));
			exp.celsius_pipe_vtx[6] = pgraph_idx_ubyte_to_float(extr(val, 0, 8));
			exp.celsius_pipe_vtx[7] = pgraph_idx_ubyte_to_float(extr(val, 24, 8));
		}
		insrt(exp.valid[1], 1, 1, 1);
		int vidx = (cls == 0x48 ? extr(exp.misc24[2], 0, 4) : idx);
		insrt(exp.valid[0], vidx, 1, 0);
	}